

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::AsyncInputStream::pumpTo(AsyncInputStream *this,AsyncOutputStream *output,uint64_t amount)

{
  AsyncOutputStream *pAVar1;
  Disposer *pDVar2;
  AttachmentPromiseNodeBase *this_00;
  _func_int **in_RCX;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *pPVar3;
  AsyncPump *ptrCopy;
  Promise<unsigned_long> PVar4;
  Promise<unsigned_long> promise;
  char local_40;
  undefined7 uStack_3f;
  AsyncOutputStream *local_38;
  _func_int **pp_Stack_30;
  
  (**(code **)(*(long *)amount + 0x10))(&stack0xffffffffffffffc0,amount,output);
  if (local_40 == '\x01') {
    this->_vptr_AsyncInputStream = (_func_int **)local_38;
    this[1]._vptr_AsyncInputStream = pp_Stack_30;
    pPVar3 = extraout_RDX;
  }
  else {
    pDVar2 = (Disposer *)operator_new(0x1020);
    pDVar2->_vptr_Disposer = (_func_int **)output;
    pDVar2[1]._vptr_Disposer = (_func_int **)amount;
    pDVar2[2]._vptr_Disposer = in_RCX;
    pDVar2[3]._vptr_Disposer = (_func_int **)0x0;
    anon_unknown_77::AsyncPump::pump((AsyncPump *)&stack0xffffffffffffffc0);
    this_00 = (AttachmentPromiseNodeBase *)operator_new(0x28);
    kj::_::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase
              (this_00,(Own<kj::_::PromiseNode> *)&stack0xffffffffffffffc0);
    pAVar1 = local_38;
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00629ab8;
    this_00[1].super_PromiseNode._vptr_PromiseNode =
         (_func_int **)&kj::_::HeapDisposer<kj::(anonymous_namespace)::AsyncPump>::instance;
    this_00[1].dependency.disposer = pDVar2;
    this->_vptr_AsyncInputStream =
         (_func_int **)
         &kj::_::
          HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AsyncPump>>>
          ::instance;
    this[1]._vptr_AsyncInputStream = (_func_int **)this_00;
    pPVar3 = extraout_RDX_00;
    if (local_38 != (AsyncOutputStream *)0x0) {
      local_38 = (AsyncOutputStream *)0x0;
      (*(code *)**(undefined8 **)CONCAT71(uStack_3f,local_40))
                ((undefined8 *)CONCAT71(uStack_3f,local_40),
                 pAVar1->_vptr_AsyncOutputStream[-2] + (long)&pAVar1->_vptr_AsyncOutputStream);
      pPVar3 = extraout_RDX_01;
    }
  }
  PVar4.super_PromiseBase.node.ptr = pPVar3;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar4.super_PromiseBase.node;
}

Assistant:

Promise<uint64_t> AsyncInputStream::pumpTo(
    AsyncOutputStream& output, uint64_t amount) {
  // See if output wants to dispatch on us.
  KJ_IF_MAYBE(result, output.tryPumpFrom(*this, amount)) {
    return kj::mv(*result);
  }

  // OK, fall back to naive approach.
  auto pump = heap<AsyncPump>(*this, output, amount);
  auto promise = pump->pump();
  return promise.attach(kj::mv(pump));
}